

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx::forward_fp16s
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  Mat local_c8;
  Option opt_flatten;
  
  local_c8.dims = bottom_blob->dims;
  if (local_c8.dims == 2) {
    iVar4 = *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx[-3]) /
            *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]);
    local_c8.w = bottom_blob->w;
    if (bottom_blob->w == iVar4) {
      local_c8.w = iVar4;
      if (1 < bottom_blob->elempack * bottom_blob->h) {
        Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]
                                     ),bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
        iVar4 = *(int *)(&this->field_0xe0 + (long)p_Var2);
        iVar5 = cpu_support_x86_f16c();
        if (iVar5 == 0) {
          return 0;
        }
        innerproduct_gemm_fp16s_sse_f16c
                  (bottom_blob,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x178 + (long)p_Var2),iVar4,
                   (Mat *)(&this->field_0xe8 + (long)p_Var2),opt);
        return 0;
      }
    }
  }
  else {
    local_c8.w = bottom_blob->w;
  }
  piVar3 = bottom_blob->refcount;
  local_c8.data = bottom_blob->data;
  local_c8.refcount = bottom_blob->refcount;
  local_c8.elemsize = bottom_blob->elemsize;
  local_c8.elempack = bottom_blob->elempack;
  local_c8.allocator = bottom_blob->allocator;
  local_c8.h = bottom_blob->h;
  local_c8.d = bottom_blob->d;
  local_c8.c = bottom_blob->c;
  local_c8.cstep = bottom_blob->cstep;
  iVar4 = local_c8.dims;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
    iVar4 = bottom_blob->dims;
  }
  if (iVar4 != 1) {
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_basic = opt->use_subgroup_basic;
    opt_flatten.use_subgroup_vote = opt->use_subgroup_vote;
    opt_flatten.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_flatten.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_reserved_6 = opt->use_reserved_6;
    opt_flatten.use_reserved_7 = opt->use_reserved_7;
    opt_flatten.use_reserved_8 = opt->use_reserved_8;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_c8);
  }
  uVar1 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx[-3]);
  if (opt->use_packing_layout == true) {
    lVar8 = 8;
    if ((uVar1 & 7) != 0) {
      lVar8 = (ulong)((uVar1 & 3) == 0) * 3 + 1;
    }
  }
  else {
    lVar8 = 1;
  }
  iVar5 = (int)lVar8;
  Mat::create(top_blob,(int)uVar1 / iVar5,
              lVar8 * (local_c8.elemsize / (ulong)(long)local_c8.elempack),iVar5,opt->blob_allocator
             );
  iVar4 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar7 = 0;
    iVar4 = iVar7;
    if (iVar5 == 1) {
      p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
      iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var2);
      iVar7 = cpu_support_x86_f16c();
      if (iVar7 != 0) {
        innerproduct_fp16s_sse_f16c
                  (&local_c8,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x178 + (long)p_Var2),iVar5,
                   (Mat *)(&this->field_0xe8 + (long)p_Var2),opt);
      }
    }
    else if (iVar5 == 4) {
      p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
      iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var2);
      iVar7 = cpu_support_x86_f16c();
      if (iVar7 != 0) {
        innerproduct_fp16s_pack4_sse_f16c
                  (&local_c8,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x178 + (long)p_Var2),iVar5,
                   (Mat *)(&this->field_0xe8 + (long)p_Var2),opt);
      }
    }
    else {
      iVar4 = 0;
      if (iVar5 == 8) {
        p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
        iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var2);
        iVar6 = cpu_support_x86_f16c();
        iVar4 = iVar7;
        if (iVar6 != 0) {
          innerproduct_fp16s_pack8_avx_f16c
                    (&local_c8,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x178 + (long)p_Var2),iVar5,
                     (Mat *)(&this->field_0xe8 + (long)p_Var2),opt);
        }
      }
    }
  }
  if (local_c8.refcount != (int *)0x0) {
    LOCK();
    *local_c8.refcount = *local_c8.refcount + -1;
    UNLOCK();
    if (*local_c8.refcount == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int InnerProduct_x86_avx::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}